

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O2

int __thiscall glu::VarType::getScalarSize(VarType *this)

{
  Type TVar1;
  int iVar2;
  int iVar3;
  StructType *pSVar4;
  pointer pSVar5;
  
  TVar1 = this->m_type;
  if (TVar1 == TYPE_STRUCT) {
    pSVar4 = (this->m_data).structPtr;
    iVar2 = 0;
    for (pSVar5 = (pSVar4->m_members).
                  super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pSVar5 != (pSVar4->m_members).
                  super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                  super__Vector_impl_data._M_finish; pSVar5 = pSVar5 + 1) {
      iVar3 = getScalarSize(&pSVar5->m_type);
      iVar2 = iVar2 + iVar3;
      pSVar4 = (this->m_data).structPtr;
    }
  }
  else if (TVar1 == TYPE_ARRAY) {
    iVar2 = getScalarSize((this->m_data).array.elementType);
    iVar2 = iVar2 * (this->m_data).array.size;
  }
  else {
    iVar2 = 0;
    if (TVar1 == TYPE_BASIC) {
      iVar2 = getDataTypeScalarSize((this->m_data).basic.type);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int VarType::getScalarSize (void) const
{
	switch (m_type)
	{
		case TYPE_BASIC:	return glu::getDataTypeScalarSize(m_data.basic.type);
		case TYPE_ARRAY:	return m_data.array.elementType->getScalarSize()*m_data.array.size;

		case TYPE_STRUCT:
		{
			int size = 0;
			for (StructType::ConstIterator iter = m_data.structPtr->begin(); iter != m_data.structPtr->end(); iter++)
				size += iter->getType().getScalarSize();
			return size;
		}

		default:
			DE_ASSERT(false);
			return 0;
	}
}